

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

int make_absent_tree(Node **node,Node *absent,Node *expr,int is_range_cutter,ParseEnv *env)

{
  int iVar1;
  Node *pNVar2;
  Node *local_a8;
  Node *body;
  Node *quant;
  Node *ns [7];
  Node *x;
  int local_48;
  int possessive;
  int id2;
  int id1;
  int i;
  int r;
  ParseEnv *env_local;
  Node *pNStack_28;
  int is_range_cutter_local;
  Node *expr_local;
  Node *absent_local;
  Node **node_local;
  
  id1 = -5;
  for (id2 = 0; id2 < 7; id2 = id2 + 1) {
    ns[(long)id2 + -1] = (Node *)0x0;
  }
  ns[3] = expr;
  ns[4] = absent;
  _i = env;
  env_local._4_4_ = is_range_cutter;
  pNStack_28 = expr;
  expr_local = absent;
  absent_local = (Node *)node;
  if (is_range_cutter == 0) {
    if (expr == (Node *)0x0) {
      body = node_new_quantifier(0,-1,0);
      if (body == (Node *)0x0) goto LAB_0011d7fe;
      id1 = node_new_true_anychar(&local_a8);
      if (id1 != 0) {
        onig_node_free(body);
        goto LAB_0011d805;
      }
      x._4_4_ = 0;
      id1 = 0;
    }
    else {
      iVar1 = is_simple_one_char_repeat(expr,&body,&local_a8,(int *)((long)&x + 4),env);
      if (iVar1 == 0) goto LAB_0011d668;
    }
    id1 = make_absent_tree_for_simple_one_char_repeat
                    ((Node **)absent_local,expr_local,body,local_a8,x._4_4_,_i);
    onig_node_free(body);
    if (id1 == 0) {
      return 0;
    }
    ns[3] = (Node *)0x0;
    onig_node_free(local_a8);
  }
  else {
LAB_0011d668:
    id1 = node_new_save_gimmick(&quant,SAVE_RIGHT_RANGE,_i);
    if (id1 != 0) goto LAB_0011d805;
    possessive = (quant->u).quant.upper;
    id1 = node_new_save_gimmick(ns,SAVE_S,_i);
    if (id1 != 0) goto LAB_0011d805;
    local_48 = (ns[0]->u).quant.upper;
    id1 = node_new_true_anychar(ns + 2);
    if (id1 != 0) goto LAB_0011d805;
    x._4_4_ = 1;
    id1 = make_absent_engine(ns + 1,possessive,expr_local,ns[2],0,-1,1,env_local._4_4_,_i);
    if (id1 != 0) goto LAB_0011d805;
    ns[2] = (Node *)0x0;
    ns[4] = (Node *)0x0;
    id1 = node_new_update_var_gimmick(ns + 2,UPDATE_VAR_S_FROM_STACK,local_48,_i);
    if (id1 != 0) goto LAB_0011d805;
    if (env_local._4_4_ == 0) {
      id1 = make_absent_tail(ns + 4,ns + 5,possessive,_i);
      if (id1 != 0) goto LAB_0011d805;
      pNVar2 = make_list(7,&quant);
    }
    else {
      pNVar2 = make_list(4,&quant);
    }
    if (pNVar2 != (Node *)0x0) {
      *(Node **)&absent_local->u = pNVar2;
      return 0;
    }
LAB_0011d7fe:
    id1 = -5;
  }
LAB_0011d805:
  for (id2 = 0; id2 < 7; id2 = id2 + 1) {
    onig_node_free(ns[(long)id2 + -1]);
  }
  return id1;
}

Assistant:

static int
make_absent_tree(Node** node, Node* absent, Node* expr, int is_range_cutter,
                 ParseEnv* env)
{
  int r;
  int i;
  int id1, id2;
  int possessive;
  Node* x;
  Node* ns[7];

  r = ONIGERR_MEMORY;
  for (i = 0; i < 7; i++) ns[i] = NULL_NODE;
  ns[4] = expr; ns[5] = absent;

  if (is_range_cutter == 0) {
    Node* quant;
    Node* body;

    if (expr == NULL_NODE) {
      /* default expr \O* */
      quant = node_new_quantifier(0, INFINITE_REPEAT, FALSE);
      if (IS_NULL(quant)) goto err0;

      r = node_new_true_anychar(&body);
      if (r != 0) {
        onig_node_free(quant);
        goto err;
      }
      possessive = 0;
      goto simple;
    }
    else {
      if (is_simple_one_char_repeat(expr, &quant, &body, &possessive, env)) {
      simple:
        r = make_absent_tree_for_simple_one_char_repeat(node, absent, quant,
                                                        body, possessive, env);
        onig_node_free(quant);
        if (r != 0) {
          ns[4] = NULL_NODE;
          onig_node_free(body);
          goto err;
        }

        return ONIG_NORMAL;
      }
    }
  }

  r = node_new_save_gimmick(&ns[0], SAVE_RIGHT_RANGE, env);
  if (r != 0) goto err;

  id1 = GIMMICK_(ns[0])->id;

  r = node_new_save_gimmick(&ns[1], SAVE_S, env);
  if (r != 0) goto err;

  id2 = GIMMICK_(ns[1])->id;

  r = node_new_true_anychar(&ns[3]);
  if (r != 0) goto err;

  possessive = 1;
  r = make_absent_engine(&ns[2], id1, absent, ns[3], 0, INFINITE_REPEAT,
                         possessive, is_range_cutter, env);
  if (r != 0) goto err;

  ns[3] = NULL_NODE;
  ns[5] = NULL_NODE;

  r = node_new_update_var_gimmick(&ns[3], UPDATE_VAR_S_FROM_STACK, id2, env);
  if (r != 0) goto err;

  if (is_range_cutter != 0) {
    x = make_list(4, ns);
    if (IS_NULL(x)) goto err0;
  }
  else {
    r = make_absent_tail(&ns[5], &ns[6], id1, env);
    if (r != 0) goto err;

    x = make_list(7, ns);
    if (IS_NULL(x)) goto err0;
  }

  *node = x;
  return ONIG_NORMAL;

 err0:
  r = ONIGERR_MEMORY;
 err:
  for (i = 0; i < 7; i++) onig_node_free(ns[i]);
  return r;
}